

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_logger.hpp
# Opt level: O3

void __thiscall
duckdb::HTTPLogger::Log<duckdb_httplib::Request,duckdb_httplib::Response>
          (HTTPLogger *this,Request *req,Response *res)

{
  pointer pcVar1;
  int iVar2;
  ClientConfig *pCVar3;
  IOException *this_00;
  int *piVar4;
  char *params_1;
  ios_base *this_01;
  ofstream out;
  string local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  long local_230;
  filebuf local_228 [24];
  byte abStack_210 [96];
  ios_base local_1b0 [120];
  ios_base local_138 [264];
  
  pCVar3 = ClientConfig::GetConfig(this->context);
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar2 != 0) {
    ::std::__throw_system_error(iVar2);
  }
  if ((pCVar3->http_logging_output)._M_string_length == 0) {
    ::std::__cxx11::stringstream::stringstream((stringstream *)&local_230);
    TemplatedWriteRequests<std::__cxx11::stringstream,duckdb_httplib::Request,duckdb_httplib::Response>
              ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_230
               ,req,res);
    ::std::__cxx11::stringbuf::str();
    Printer::Print(&local_270);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p);
    }
    ::std::__cxx11::stringstream::~stringstream((stringstream *)&local_230);
    this_01 = local_1b0;
  }
  else {
    ::std::ofstream::ofstream(&local_230,(string *)&pCVar3->http_logging_output,_S_app);
    TemplatedWriteRequests<std::ofstream,duckdb_httplib::Request,duckdb_httplib::Response>
              ((basic_ofstream<char,_std::char_traits<char>_> *)&local_230,req,res);
    ::std::ofstream::close();
    if ((abStack_210[*(long *)(local_230 + -0x18)] & 5) != 0) {
      this_00 = (IOException *)__cxa_allocate_exception(0x10);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_270,"Failed to write HTTP log to file \"%s\": %s","");
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      pcVar1 = (pCVar3->http_logging_output)._M_dataplus._M_p;
      ::std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,pcVar1,pcVar1 + (pCVar3->http_logging_output)._M_string_length
                );
      piVar4 = __errno_location();
      params_1 = strerror(*piVar4);
      IOException::IOException<std::__cxx11::string,char*>(this_00,&local_270,&local_250,params_1);
      __cxa_throw(this_00,&IOException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_230 = _VTT;
    *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = __invalid_argument;
    ::std::filebuf::~filebuf(local_228);
    this_01 = local_138;
  }
  ::std::ios_base::~ios_base(this_01);
  pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
  return;
}

Assistant:

void Log(const REQUEST &req, const RESPONSE &res) {
		const auto &config = ClientConfig::GetConfig(context);
		D_ASSERT(config.enable_http_logging);

		lock_guard<mutex> guard(lock);
		if (config.http_logging_output.empty()) {
			stringstream out;
			TemplatedWriteRequests(out, req, res);
			Printer::Print(out.str());
		} else {
			ofstream out(config.http_logging_output, ios::app);
			TemplatedWriteRequests(out, req, res);
			out.close();
			// Throw an IO exception if it fails to write to the file
			if (out.fail()) {
				throw IOException("Failed to write HTTP log to file \"%s\": %s", config.http_logging_output,
				                  strerror(errno));
			}
		}
	}